

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O3

void cw_out_bufs_free(cw_out_ctx *ctx)

{
  cw_out_buf *pcVar1;
  cw_out_buf *pcVar2;
  
  pcVar2 = ctx->buf;
  while (pcVar2 != (cw_out_buf *)0x0) {
    pcVar1 = pcVar2->next;
    Curl_dyn_free(&pcVar2->b);
    (*Curl_cfree)(pcVar2);
    ctx->buf = pcVar1;
    pcVar2 = pcVar1;
  }
  return;
}

Assistant:

static void cw_out_bufs_free(struct cw_out_ctx *ctx)
{
  while(ctx->buf) {
    struct cw_out_buf *next = ctx->buf->next;
    cw_out_buf_free(ctx->buf);
    ctx->buf = next;
  }
}